

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O0

TestFactoryBase * __thiscall
testing::internal::TestMetaFactory<DriverTest_Glob_Test>::CreateTestFactory
          (TestMetaFactory<DriverTest_Glob_Test> *this,ParamType *parameter)

{
  ParameterizedTestFactory<DriverTest_Glob_Test> *this_00;
  ParamType local_38;
  ParamType *local_18;
  ParamType *parameter_local;
  TestMetaFactory<DriverTest_Glob_Test> *this_local;
  
  local_18 = parameter;
  parameter_local = (ParamType *)this;
  this_00 = (ParameterizedTestFactory<DriverTest_Glob_Test> *)operator_new(0x28);
  std::__cxx11::string::string((string *)&local_38,(string *)parameter);
  ParameterizedTestFactory<DriverTest_Glob_Test>::ParameterizedTestFactory(this_00,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  return &this_00->super_TestFactoryBase;
}

Assistant:

virtual TestFactoryBase* CreateTestFactory(ParamType parameter) {
    return new ParameterizedTestFactory<TestCase>(parameter);
  }